

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O3

void __thiscall deci::parser_t::yy_stack_print_(parser_t *this)

{
  pointer psVar1;
  undefined8 in_RAX;
  ostream *this_00;
  pointer psVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(this->yycdebug_,"Stack now",9);
  psVar2 = (this->yystack_).seq_.
           super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->yystack_).seq_.
           super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
      this_00 = std::__ostream_insert<char,std::char_traits<char>>
                          (this->yycdebug_,(char *)((long)&uStack_28 + 6),1);
      std::ostream::operator<<
                (this_00,(int)(psVar2->super_basic_symbol<deci::parser_t::by_state>).super_by_state.
                              state);
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->yycdebug_,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void
   parser_t ::yy_stack_print_ () const
  {
    *yycdebug_ << "Stack now";
    for (stack_type::const_iterator
           i = yystack_.begin (),
           i_end = yystack_.end ();
         i != i_end; ++i)
      *yycdebug_ << ' ' << int (i->state);
    *yycdebug_ << '\n';
  }